

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  char *pcVar2;
  Ch *pCVar3;
  
  pCVar1 = is->src_;
  pCVar3 = pCVar1 + 1;
  is->src_ = pCVar3;
  if (pCVar1[1] == 'a') {
    pCVar3 = pCVar1 + 2;
    is->src_ = pCVar3;
    if (pCVar1[2] == 'l') {
      pCVar3 = pCVar1 + 3;
      is->src_ = pCVar3;
      if (pCVar1[3] == 's') {
        pCVar3 = pCVar1 + 4;
        is->src_ = pCVar3;
        if (pCVar1[4] == 'e') {
          is->src_ = pCVar1 + 5;
          pcVar2 = (handler->stack_).stackTop_;
          if ((handler->stack_).stackEnd_ < pcVar2 + 0x10) {
            internal::Stack<rapidjson::CrtAllocator>::
            Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
            pcVar2 = (handler->stack_).stackTop_;
          }
          (handler->stack_).stackTop_ = pcVar2 + 0x10;
          pcVar2[0] = '\0';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          pcVar2[4] = '\0';
          pcVar2[5] = '\0';
          pcVar2[6] = '\0';
          pcVar2[7] = '\0';
          pcVar2[8] = '\0';
          pcVar2[9] = '\0';
          pcVar2[10] = '\0';
          pcVar2[0xb] = '\0';
          pcVar2[0xc] = '\0';
          pcVar2[0xd] = '\0';
          pcVar2[0xe] = '\0';
          pcVar2[0xf] = '\0';
          pcVar2[0xe] = '\t';
          pcVar2[0xf] = '\0';
          return;
        }
      }
    }
  }
  pCVar1 = is->head_;
  *(undefined4 *)(this + 0x30) = 3;
  *(long *)(this + 0x38) = (long)pCVar3 - (long)pCVar1;
  return;
}

Assistant:

Ch Take() { return *src_++; }